

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_12::WriteBatchItemPrinter::~WriteBatchItemPrinter(WriteBatchItemPrinter *this)

{
  WriteBatch::Handler::~Handler(&this->super_Handler);
  operator_delete(this,0x10);
  return;
}

Assistant:

void Put(const Slice& key, const Slice& value) override {
    std::string r = "  put '";
    AppendEscapedStringTo(&r, key);
    r += "' '";
    AppendEscapedStringTo(&r, value);
    r += "'\n";
    dst_->Append(r);
  }